

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void Excel::Parser::loadGlobals
               (vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_> *boundSheets,
               Stream *stream,IStorage *storage)

{
  uint16_t uVar1;
  undefined8 uVar2;
  wstring *in_RDI;
  Record r;
  BOF bof;
  value_type *in_stack_fffffffffffffd58;
  Record *in_stack_fffffffffffffd60;
  allocator *paVar3;
  wstring *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  BiffVersion in_stack_fffffffffffffd74;
  Record *in_stack_fffffffffffffd78;
  Record *in_stack_fffffffffffffd80;
  allocator local_261;
  wstring local_260 [36];
  int local_23c;
  BiffVersion in_stack_fffffffffffffdd4;
  Record *in_stack_fffffffffffffdd8;
  IStorage *in_stack_fffffffffffffde8;
  undefined6 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf6;
  allocator in_stack_fffffffffffffdf7;
  wstring local_208 [48];
  Record local_1d8;
  BOF local_20 [3];
  wstring *local_8;
  
  local_8 = in_RDI;
  BOF::BOF(local_20);
  do {
    Record::Record(in_stack_fffffffffffffd80,(Stream *)in_stack_fffffffffffffd78);
    uVar1 = Record::code(&local_1d8);
    if (uVar1 == 10) {
      local_23c = 1;
    }
    else {
      if (uVar1 == 0x22) {
        handleDateMode(in_stack_fffffffffffffd60,(IStorage *)in_stack_fffffffffffffd58);
      }
      else {
        if (uVar1 == 0x2f) {
          uVar2 = __cxa_allocate_exception(0x30);
          paVar3 = (allocator *)&stack0xfffffffffffffdf7;
          std::allocator<wchar_t>::allocator();
          std::__cxx11::wstring::wstring
                    (local_208,L"This file is protected. Decryption is not implemented yet.",paVar3)
          ;
          Exception::Exception
                    ((Exception *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                     in_stack_fffffffffffffd68);
          __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
        }
        if (uVar1 == 0x85) {
          in_stack_fffffffffffffd68 = local_8;
          in_stack_fffffffffffffd74 = BOF::version(local_20);
          parseBoundSheet(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4);
          std::vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_>::push_back
                    ((vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_> *)
                     in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
          BoundSheet::~BoundSheet((BoundSheet *)0x10707c);
        }
        else if (uVar1 == 0xfc) {
          parseSST((Record *)
                   CONCAT17(in_stack_fffffffffffffdf7,
                            CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
                   in_stack_fffffffffffffde8);
        }
        else if (uVar1 == 0x809) {
          BOF::parse((BOF *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        }
        else if (uVar1 == 0xffff) {
          uVar2 = __cxa_allocate_exception(0x30);
          paVar3 = &local_261;
          std::allocator<wchar_t>::allocator();
          std::__cxx11::wstring::wstring(local_260,L"Wrong format.",paVar3);
          Exception::Exception
                    ((Exception *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                     in_stack_fffffffffffffd68);
          __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
        }
      }
      local_23c = 0;
    }
    Record::~Record(in_stack_fffffffffffffd60);
  } while (local_23c == 0);
  return;
}

Assistant:

inline void
Parser::loadGlobals( std::vector< BoundSheet > & boundSheets, 
	Stream & stream, IStorage & storage )
{
	BOF bof;

	while( true )
	{
		Record r( stream );

		switch( r.code() )
		{
			case XL_BOF :
				bof.parse( r );
				break;

			case XL_FILEPASS :
				throw Exception( L"This file is protected. Decryption is not implemented yet." );

			case XL_SST :
				parseSST( r, storage );
				break;

			case XL_BOUNDSHEET :
				boundSheets.push_back( parseBoundSheet( r, bof.version() ) );
				break;

			case XL_DATEMODE :
				handleDateMode( r, storage );
				break;

			case XL_EOF :
				return;

			case XL_UNKNOWN :
				throw Exception( L"Wrong format." );

			default:
				break;
		}
	}
}